

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O2

int __thiscall QPDFOutlineObjectHelper::getCount(QPDFOutlineObjectHelper *this)

{
  bool bVar1;
  int iVar2;
  BaseHandle *pBVar3;
  allocator<char> local_59;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_48 [16];
  string local_38;
  
  pBVar3 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_48 + 0x10),"/Count",(allocator<char> *)local_48);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_58,(string *)(local_48 + 0x10));
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  iVar2 = 0;
  if (bVar1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_48,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_48 + 0x10),"/Count",&local_59);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_58,(string *)local_48);
    iVar2 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__cxx11::string::~string((string *)(local_48 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  }
  return iVar2;
}

Assistant:

int
QPDFOutlineObjectHelper::getCount()
{
    int count = 0;
    if (oh().hasKey("/Count")) {
        count = oh().getKey("/Count").getIntValueAsInt();
    }
    return count;
}